

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

cio_error write_some_all(cio_io_stream *io_stream,cio_write_buffer *buf,
                        cio_io_stream_write_handler_t handler,void *handler_context)

{
  size_t __n;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  cio_write_buffer *pcVar5;
  
  sVar3 = 0;
  pcVar5 = buf;
  for (uVar4 = 0; sVar1 = write_check_buffer_pos, uVar4 < (buf->data).head.q_len; uVar4 = uVar4 + 1)
  {
    pcVar5 = pcVar5->next;
    __n = (pcVar5->data).element.length;
    if (__n == 0) {
      sVar2 = 0;
    }
    else {
      memcpy(write_check_buffer + write_check_buffer_pos,(pcVar5->data).element.field_0.const_data,
             __n);
      sVar2 = (pcVar5->data).element.length;
    }
    write_check_buffer_pos = sVar1 + sVar2;
    sVar3 = sVar3 + sVar2;
  }
  (*handler)(io_stream,handler_context,buf,CIO_SUCCESS,sVar3);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error write_some_all(struct cio_io_stream *io_stream, struct cio_write_buffer *buf, cio_io_stream_write_handler_t handler, void *handler_context)
{
	struct cio_write_buffer *wb = buf->next;
	size_t total_length = 0;

	for (size_t i = 0; i < cio_write_buffer_get_num_buffer_elements(buf); i++) {
		if (wb->data.element.length > 0) {
			memcpy(&write_check_buffer[write_check_buffer_pos], wb->data.element.const_data, wb->data.element.length);
		}

		write_check_buffer_pos += wb->data.element.length;
		total_length += wb->data.element.length;
		wb = wb->next;
	}

	handler(io_stream, handler_context, buf, CIO_SUCCESS, total_length);

	return CIO_SUCCESS;
}